

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

bool Assimp::Q3Shader::LoadSkin(SkinData *fill,string *pFile,IOSystem *io)

{
  int iVar1;
  IOStream *__p;
  pointer pIVar2;
  Logger *this;
  undefined4 extraout_var;
  size_type __n;
  reference pvVar3;
  iterator __first;
  iterator __last;
  char *__s1;
  unsigned_long *puVar4;
  char **in;
  char **in_00;
  string local_170;
  reference local_150;
  TextureEntry *entry;
  size_type sStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined8 local_108;
  unsigned_long local_100 [2];
  undefined1 local_f0 [8];
  string ss;
  char *local_b8;
  char *buff;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> _buff;
  size_t s;
  undefined4 local_68;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *io_local;
  string *pFile_local;
  SkinData *fill_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)io;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rt",&local_51);
  __p = IOSystem::Open(io,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    fill_local._7_1_ = false;
    local_68 = 1;
  }
  else {
    this = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "Loading Quake3 skin file ",pFile);
    Logger::info(this,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    iVar1 = (*pIVar2->_vptr_IOStream[6])();
    _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         CONCAT44(extraout_var,iVar1);
    __n = _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_a8,__n,
               (allocator_type *)((long)&buff + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&buff + 7));
    local_b8 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_a8,0);
    pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_a8,0);
    (*pIVar2->_vptr_IOStream[2])
              (pIVar2,pvVar3,_buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,1)
    ;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_a8,
                        _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    *pvVar3 = '\0';
    __first = std::vector<char,_std::allocator<char>_>::begin
                        ((vector<char,_std::allocator<char>_> *)local_a8);
    __last = std::vector<char,_std::allocator<char>_>::end
                       ((vector<char,_std::allocator<char>_> *)local_a8);
    ss.field_2._M_local_buf[0xf] = ',';
    ss.field_2._M_local_buf[0xe] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
              ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               __first._M_current,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               __last._M_current,ss.field_2._M_local_buf + 0xf,ss.field_2._M_local_buf + 0xe);
    while (*local_b8 != '\0') {
      SkipSpacesAndLineEnd<char>(&local_b8);
      GetNextToken_abi_cxx11_((string *)local_f0,(Assimp *)&local_b8,in);
      __s1 = (char *)std::__cxx11::string::operator[]((ulong)local_f0);
      local_100[1] = 4;
      local_100[0] = std::__cxx11::string::length();
      puVar4 = std::min<unsigned_long>(local_100 + 1,local_100);
      iVar1 = strncmp(__s1,"tag_",*puVar4);
      if (iVar1 == 0) {
        local_68 = 3;
      }
      else {
        local_128.field_2._M_allocated_capacity = 0;
        local_128.field_2._8_8_ = 0;
        local_128._M_dataplus = (_Alloc_hider)0x0;
        local_128._1_7_ = 0;
        local_128._M_string_length = 0;
        local_138._M_allocated_capacity = 0;
        local_138._8_8_ = 0;
        entry = (TextureEntry *)0x0;
        sStack_140 = 0;
        local_108._0_1_ = false;
        local_108._1_7_ = 0;
        SkinData::TextureEntry::TextureEntry((TextureEntry *)&entry);
        std::__cxx11::
        list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
        ::push_back(&fill->textures,(value_type *)&entry);
        SkinData::TextureEntry::~TextureEntry((TextureEntry *)&entry);
        local_150 = std::__cxx11::
                    list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                    ::back(&fill->textures);
        std::__cxx11::string::operator=((string *)local_150,(string *)local_f0);
        GetNextToken_abi_cxx11_(&local_170,(Assimp *)&local_b8,in_00);
        std::__cxx11::string::operator=
                  ((string *)
                   &(local_150->
                    super_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).second,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        local_68 = 0;
      }
      std::__cxx11::string::~string((string *)local_f0);
    }
    fill_local._7_1_ = true;
    local_68 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_a8);
  }
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return fill_local._7_1_;
}

Assistant:

bool Q3Shader::LoadSkin(SkinData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO("Loading Quake3 skin file " + pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);const char* buff = &_buff[0];
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove commas
    std::replace(_buff.begin(),_buff.end(),',',' ');

    // read token by token and fill output table
    for (;*buff;) {
        SkipSpacesAndLineEnd(&buff);

        // get first identifier
        std::string ss = GetNextToken(buff);

        // ignore tokens starting with tag_
        if (!::strncmp(&ss[0],"tag_",std::min((size_t)4, ss.length())))
            continue;

        fill.textures.push_back(SkinData::TextureEntry());
        SkinData::TextureEntry &entry = fill.textures.back();

        entry.first  = ss;
        entry.second = GetNextToken(buff);
    }
    return true;
}